

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O2

uint32 __thiscall google::protobuf::io::CodedInputStream::ReadTagFallback(CodedInputStream *this)

{
  long lVar1;
  byte *pbVar2;
  byte *pbVar3;
  int iVar4;
  uint32 uVar6;
  long lVar7;
  int iVar5;
  
  pbVar2 = this->buffer_;
  iVar5 = (int)this->buffer_end_;
  iVar4 = iVar5 - (int)pbVar2;
  if (9 < iVar4) {
LAB_0018dd89:
    uVar6 = *pbVar2 & 0x7f;
    if ((char)*pbVar2 < '\0') {
      uVar6 = uVar6 | (pbVar2[1] & 0x7f) << 7;
      if ((char)pbVar2[1] < '\0') {
        uVar6 = uVar6 | (pbVar2[2] & 0x7f) << 0xe;
        if ((char)pbVar2[2] < '\0') {
          uVar6 = uVar6 | (pbVar2[3] & 0x7f) << 0x15;
          if ((char)pbVar2[3] < '\0') {
            pbVar3 = pbVar2 + 5;
            uVar6 = uVar6 | (uint)pbVar2[4] << 0x1c;
            if ((char)pbVar2[4] < '\0') {
              lVar7 = 0;
              do {
                if ((int)lVar7 == 5) {
                  return 0;
                }
                lVar1 = lVar7 + 1;
                pbVar2 = pbVar3 + lVar7;
                lVar7 = lVar1;
              } while ((char)*pbVar2 < '\0');
              pbVar3 = pbVar3 + lVar1;
            }
          }
          else {
            pbVar3 = pbVar2 + 4;
          }
        }
        else {
          pbVar3 = pbVar2 + 3;
        }
      }
      else {
        pbVar3 = pbVar2 + 2;
      }
    }
    else {
      pbVar3 = pbVar2 + 1;
    }
    this->buffer_ = pbVar3;
    return uVar6;
  }
  if (iVar4 < 1) {
    if (iVar5 == (int)pbVar2) {
      if (((0 < this->buffer_size_after_limit_) || (this->total_bytes_read_ == this->current_limit_)
          ) && (this->total_bytes_read_ - this->buffer_size_after_limit_ < this->total_bytes_limit_)
         ) {
        this->legitimate_message_end_ = true;
        return 0;
      }
    }
  }
  else if (-1 < (char)this->buffer_end_[-1]) goto LAB_0018dd89;
  uVar6 = ReadTagSlow(this);
  return uVar6;
}

Assistant:

inline int CodedInputStream::BufferSize() const {
  return buffer_end_ - buffer_;
}